

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

void __thiscall rtosc::Ports::refreshMagic(Ports *this)

{
  char cVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Port_Matcher *pPVar11;
  bool *pbVar12;
  char *pcVar13;
  int *piVar14;
  pointer pvVar15;
  ulong uVar16;
  pointer pbVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  iterator __end1;
  pointer pPVar21;
  _Alloc_hider _Var22;
  iterator __begin1;
  pointer pPVar23;
  pointer pbVar24;
  bool bVar25;
  char *arg;
  string tmp;
  int pos_best;
  tvec_t hashed;
  cvec_t args;
  svec_t keys;
  int local_11c;
  ivec_t local_118;
  value_type local_100;
  int local_dc;
  undefined1 local_d8 [32];
  ivec_t *local_b8;
  Ports *local_b0;
  Port_Matcher *local_a8;
  ulong local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  int local_7c;
  vector<const_char_*,_std::allocator<const_char_*>_> local_78;
  pointer *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  pointer local_40;
  pointer local_38;
  
  pPVar11 = this->impl;
  if (pPVar11 != (Port_Matcher *)0x0) {
    Port_Matcher::~Port_Matcher(pPVar11);
  }
  operator_delete(pPVar11,0x80);
  pPVar11 = (Port_Matcher *)operator_new(0x80);
  pPVar21 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar23 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar16 = ((long)pPVar23 - (long)pPVar21 >> 3) * 0x6db6db6db6db6db7;
  pbVar12 = (bool *)operator_new__((long)(int)uVar16);
  pPVar11->m_enump = pbVar12;
  (pPVar11->fixed).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar11->fixed).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar11->fixed).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar11->arg_spec).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar11->arg_spec).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar11->arg_spec).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar11->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pPVar11->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pPVar11->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pPVar11->assoc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pPVar11->assoc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pPVar11->assoc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pPVar11->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pPVar11->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pPVar11->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->impl = pPVar11;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (char **)0x0;
  local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (char **)0x0;
  local_b0 = this;
  local_a8 = pPVar11;
  if (pPVar23 != pPVar21) {
    uVar18 = 1;
    pPVar23 = pPVar21;
    bVar7 = 0;
    do {
      bVar6 = bVar7;
      pcVar13 = strchr(pPVar23->name,0x23);
      pPVar23 = pPVar23 + 1;
      bVar25 = uVar18 <= uVar16;
      lVar5 = uVar16 - uVar18;
      uVar18 = (ulong)((int)uVar18 + 1);
      bVar7 = bVar6 | pcVar13 != (char *)0x0;
    } while (bVar25 && lVar5 != 0);
    if ((bool)(bVar6 | pcVar13 != (char *)0x0)) goto LAB_00107079;
    uVar16 = 0;
    uVar18 = 1;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,pPVar21[uVar16].name,(allocator<char> *)local_d8);
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      uVar8 = std::__cxx11::string::find('\0',0x3a);
      if (0 < (int)uVar8) {
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((local_b0->ports).
                             super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar16].name + (uVar8 & 0x7fffffff));
        std::__cxx11::string::substr((ulong)local_d8,(ulong)&local_100);
        std::__cxx11::string::operator=((string *)&local_100,(string *)local_d8);
        if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,
                          (ulong)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                                          local_d8._16_8_)->_M_impl).super__Vector_impl_data.
                                         _M_start + 1));
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,&local_100);
      if (local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_78,
                   (iterator)
                   local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,(char **)&local_118);
      }
      else {
        *local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (char *)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
        local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      pPVar21 = (local_b0->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar16 = ((long)(local_b0->ports).
                      super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pPVar21 >> 3) * 0x6db6db6db6db6db7;
      bVar25 = uVar18 <= uVar16;
      lVar5 = uVar16 - uVar18;
      uVar16 = uVar18;
      uVar18 = (ulong)((int)uVar18 + 1);
    } while (bVar25 && lVar5 != 0);
  }
  pPVar11 = local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_a8->fixed,&local_58);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::operator=(&pPVar11->arg_spec,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,&local_58);
  pbVar17 = local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_60 = &local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uVar16 = (long)local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    iVar10 = 0;
    pbVar24 = local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar2 = (pbVar24->_M_dataplus)._M_p;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,pcVar2,pcVar2 + pbVar24->_M_string_length);
      if (iVar10 <= (int)local_100._M_string_length) {
        iVar10 = (int)local_100._M_string_length;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      pbVar24 = pbVar24 + 1;
    } while (pbVar24 != pbVar17);
    local_dc = -1;
    uVar8 = 0x7fffffff;
    local_b8 = (ivec_t *)(uVar16 >> 5);
LAB_00106a98:
    local_11c = 0;
    if (0 < iVar10) {
      do {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_100,
                   (vector<int,_std::allocator<int>_> *)&local_118);
        for (piVar14 = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            piVar14 !=
            local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish; piVar14 = piVar14 + 1) {
          if (*piVar14 == local_11c) goto LAB_00106b29;
        }
        if (local_100._M_string_length == local_100.field_2._M_allocated_capacity) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_100,
                     (iterator)local_100._M_string_length,&local_11c);
        }
        else {
          *(int *)local_100._M_string_length = local_11c;
          local_100._M_string_length = local_100._M_string_length + 4;
        }
        do_hash((tvec_t *)local_d8,&local_98,(ivec_t *)&local_100);
        uVar9 = count_dups<std::vector<int,std::allocator<int>>>((tvec_t *)local_d8);
        if ((int)uVar9 < (int)uVar8) {
          local_dc = local_11c;
          uVar8 = uVar9;
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((tvec_t *)local_d8);
LAB_00106b29:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_100._M_dataplus._M_p,
                          local_100.field_2._M_allocated_capacity - (long)local_100._M_dataplus._M_p
                         );
        }
        local_11c = local_11c + 1;
      } while (local_11c < iVar10);
    }
    if ((int)uVar8 < (int)local_b8) {
      if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_118,
                   (iterator)
                   local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_dc);
        local_b8 = (ivec_t *)(ulong)uVar8;
      }
      else {
        *local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_dc;
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
        local_b8 = (ivec_t *)(ulong)uVar8;
      }
      goto LAB_00106a98;
    }
    do_hash((tvec_t *)&local_100,&local_98,&local_118);
    iVar10 = count_dups<std::vector<int,std::allocator<int>>>
                       ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)&local_100);
    pPVar11 = local_a8;
    if ((iVar10 != 0) &&
       (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start)) {
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_100);
    piVar3 = (pPVar11->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (pPVar11->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (pPVar11->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (pPVar11->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (pPVar11->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((piVar3 != (pointer)0x0) &&
       (operator_delete(piVar3,(long)piVar4 - (long)piVar3),
       local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start != (pointer)0x0)) {
      operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pPVar11->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start ==
        (pPVar11->pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      refreshMagic();
    }
    else {
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_d8._16_8_ = (pointer)0x0;
      local_d8._0_8_ = (pointer)0x0;
      local_d8._8_8_ = (pointer)0x0;
      local_a0 = (long)local_98.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      if (local_a0 != 0) {
        pbVar17 = local_98.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          pcVar2 = (pbVar17->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_100,pcVar2,pcVar2 + pbVar17->_M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_string_length !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            piVar14 = (int *)(local_100._M_dataplus._M_p + local_100._M_string_length);
            _Var22._M_p = local_100._M_dataplus._M_p;
            do {
              cVar1 = *_Var22._M_p;
              local_dc = CONCAT31(local_dc._1_3_,cVar1);
              for (pvVar15 = (pointer)local_d8._0_8_; pvVar15 != (pointer)local_d8._8_8_;
                  pvVar15 = (pointer)((long)&(pvVar15->super__Vector_base<int,_std::allocator<int>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1)) {
                if (*(char *)&(pvVar15->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start == cVar1) goto LAB_00106cef;
              }
              if (local_d8._8_8_ == local_d8._16_8_) {
                std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                          ((vector<char,std::allocator<char>> *)local_d8,(iterator)local_d8._8_8_,
                           (char *)&local_dc);
              }
              else {
                *(char *)local_d8._8_8_ = cVar1;
                local_d8._8_8_ = local_d8._8_8_ + 1;
              }
LAB_00106cef:
              _Var22._M_p = _Var22._M_p + 1;
            } while ((int *)_Var22._M_p != piVar14);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          pbVar17 = pbVar17 + 1;
        } while (pbVar17 !=
                 local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_b8 = &local_a8->pos;
      uVar16 = local_a0 >> 5;
      iVar10 = 0x7f;
      do {
        local_100._M_dataplus._M_p = local_100._M_dataplus._M_p & 0xffffffff00000000;
        if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_118,
                     (iterator)
                     local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_100);
        }
        else {
          *local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 0;
          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      iVar10 = -1;
      uVar8 = 0x7fffffff;
      iVar20 = 0;
      do {
        local_40 = (pointer)local_d8._8_8_;
        pvVar15 = (pointer)local_d8._0_8_;
        local_a0 = uVar16;
        local_7c = iVar20;
        if (local_d8._0_8_ != local_d8._8_8_) {
          do {
            cVar1 = *(char *)&(pvVar15->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start;
            uVar8 = 0x7fffffff;
            iVar20 = 0;
            local_38 = pvVar15;
            do {
              local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[cVar1] = iVar20;
              do_hash((ivec_t *)&local_100,&local_98,local_b8,&local_118);
              uVar9 = count_dups<int>((vector<int,_std::allocator<int>_> *)&local_100);
              if ((int)uVar9 < (int)uVar8) {
                uVar8 = uVar9;
                iVar10 = iVar20;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity -
                                (long)local_100._M_dataplus._M_p);
              }
              iVar20 = iVar20 + 1;
            } while (iVar20 != 100);
            local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[cVar1] = iVar10;
            pvVar15 = (pointer)((long)&(local_38->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start + 1);
          } while (pvVar15 != local_40);
        }
        if ((int)local_a0 <= (int)uVar8) break;
        iVar20 = local_7c + 1;
        uVar16 = (ulong)uVar8;
      } while (iVar20 != 4);
      do_hash((ivec_t *)&local_100,&local_98,local_b8,&local_118);
      pPVar11 = local_a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_100._M_dataplus._M_p,
                        local_100.field_2._M_allocated_capacity - (long)local_100._M_dataplus._M_p);
      }
      if ((pointer)local_d8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
      }
      piVar3 = (pPVar11->assoc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (pPVar11->assoc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (pPVar11->assoc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (pPVar11->assoc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (pPVar11->assoc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if ((piVar3 != (pointer)0x0) &&
         (operator_delete(piVar3,(long)piVar4 - (long)piVar3),
         local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start != (pointer)0x0)) {
        operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_d8._0_8_ = (pointer)0x0;
      local_d8._8_8_ = (pointer)0x0;
      local_d8._16_8_ = (pointer)0x0;
      do_hash((ivec_t *)&local_100,&local_98,local_b8,&pPVar11->assoc);
      _Var22._M_p = local_100._M_dataplus._M_p;
      if (local_100._M_dataplus._M_p != (pointer)local_100._M_string_length) {
        _Var22._M_p = local_100._M_dataplus._M_p;
        iVar10 = 0;
        do {
          iVar19 = iVar10;
          iVar20 = *(int *)_Var22._M_p + 1;
          iVar10 = iVar20;
          if (iVar20 < iVar19) {
            iVar10 = iVar19;
          }
          _Var22._M_p = _Var22._M_p + 4;
        } while (_Var22._M_p != (pointer)local_100._M_string_length);
        _Var22._M_p = (pointer)local_100._M_string_length;
        if (0 < iVar10) {
          if (iVar20 < iVar19) {
            iVar20 = iVar19;
          }
          do {
            local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)((ulong)local_118.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start &
                                0xffffffff00000000);
            if (local_d8._8_8_ == local_d8._16_8_) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)local_d8,(iterator)local_d8._8_8_,
                         (int *)&local_118);
            }
            else {
              *(int *)local_d8._8_8_ = 0;
              local_d8._8_8_ = local_d8._8_8_ + 4;
            }
            iVar20 = iVar20 + -1;
            _Var22._M_p = (pointer)local_100._M_string_length;
          } while (iVar20 != 0);
        }
      }
      uVar8 = (uint)((ulong)((long)_Var22._M_p - (long)local_100._M_dataplus._M_p) >> 2);
      if ((int)uVar8 < 1) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_00106fee;
      }
      else {
        uVar16 = 0;
        do {
          *(int *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)local_d8._0_8_)->_M_impl).
                          super__Vector_impl_data._M_start +
                  (long)*(int *)(local_100._M_dataplus._M_p + uVar16 * 4) * 4) = (int)uVar16;
          uVar16 = uVar16 + 1;
        } while ((uVar8 & 0x7fffffff) != uVar16);
LAB_00106fee:
        operator_delete(local_100._M_dataplus._M_p,
                        local_100.field_2._M_allocated_capacity - (long)local_100._M_dataplus._M_p);
      }
      piVar3 = (pPVar11->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (pPVar11->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (pPVar11->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)local_d8._0_8_;
      (pPVar11->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)local_d8._8_8_;
      (pPVar11->remap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)local_d8._16_8_;
      local_d8._0_8_ = (pointer)0x0;
      local_d8._8_8_ = (pointer)0x0;
      local_d8._16_8_ = (pointer)0x0;
      if ((piVar3 != (pointer)0x0) &&
         (operator_delete(piVar3,(long)piVar4 - (long)piVar3),
         (pointer)local_d8._0_8_ != (pointer)0x0)) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  if (local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00107079:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  pPVar21 = (local_b0->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar8 = (int)((long)(local_b0->ports).
                      super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pPVar21 >> 3) * -0x49249249;
  if (0 < (int)uVar8) {
    pbVar12 = local_b0->impl->m_enump;
    uVar16 = 0;
    do {
      pcVar13 = strchr(pPVar21->name,0x23);
      pbVar12[uVar16] = pcVar13 != (char *)0x0;
      uVar16 = uVar16 + 1;
      pPVar21 = pPVar21 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar16);
  }
  local_b0->elms = uVar8;
  return;
}

Assistant:

void Ports::refreshMagic()
{
    delete impl;
    impl = new Port_Matcher(ports.size());
    generate_minimal_hash(*this, *impl);
    for(int i=0; i<(int)ports.size(); ++i)
        impl->set_enump(i, !!strchr(ports[i].name, '#'));

    elms = ports.size();
}